

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

ostream * operator<<(ostream *out,BLH blh)

{
  ostream *poVar1;
  ostream *out_local;
  
  poVar1 = std::operator<<(out,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,blh.B);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,blh.L);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,blh.H);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return out;
}

Assistant:

ostream & operator<<(ostream &out, const BLH blh)
{
    out << "(" << blh.B << ", " << blh.L << ", " << blh.H << ")" << endl;
    return out;
}